

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNode * __thiscall
ConnmanTestMsg::ConnectNodePublic
          (ConnmanTestMsg *this,PeerManager *peerman,char *pszDest,ConnectionType conn_type)

{
  long lVar1;
  CNode *node;
  long in_FS_OFFSET;
  CAddress in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress((CAddress *)&stack0xffffffffffffff98);
  node = CConnman::ConnectNode
                   (&this->super_CConnman,in_stack_ffffffffffffff98,&stack0xffffffffffffff98,
                    SUB81(pszDest,0),INBOUND,SUB41(conn_type,0));
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&stack0xffffffffffffff98);
  if (node != (CNode *)0x0) {
    LOCK();
    (node->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
    UNLOCK();
    (**(peerman->super_NetEventsInterface)._vptr_NetEventsInterface)
              (&peerman->super_NetEventsInterface,node,9);
    LOCK();
    (node->fSuccessfullyConnected)._M_base._M_i = true;
    UNLOCK();
    AddTestNode(this,node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node;
  }
  __stack_chk_fail();
}

Assistant:

CNode* ConnmanTestMsg::ConnectNodePublic(PeerManager& peerman, const char* pszDest, ConnectionType conn_type)
{
    CNode* node = ConnectNode(CAddress{}, pszDest, /*fCountFailure=*/false, conn_type, /*use_v2transport=*/true);
    if (!node) return nullptr;
    node->SetCommonVersion(PROTOCOL_VERSION);
    peerman.InitializeNode(*node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node->fSuccessfullyConnected = true;
    AddTestNode(*node);
    return node;
}